

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsCurveGeometry<2L>::NurbsCurveGeometry
          (NurbsCurveGeometry<2L> *this,Index degree,Index nb_poles,bool is_rational)

{
  Index local_80;
  Index local_50;
  long local_48 [3];
  Index local_30;
  byte local_21;
  Index IStack_20;
  bool is_rational_local;
  Index nb_poles_local;
  Index degree_local;
  NurbsCurveGeometry<2L> *this_local;
  
  local_21 = is_rational;
  IStack_20 = nb_poles;
  nb_poles_local = degree;
  degree_local = (Index)this;
  CurveBase<2L>::CurveBase(&this->super_CurveBase<2L>);
  (this->super_CurveBase<2L>)._vptr_CurveBase = (_func_int **)&PTR__NurbsCurveGeometry_00773e10;
  this->m_degree = nb_poles_local;
  local_30 = Nurbs::nb_knots(nb_poles_local,IStack_20);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_knots,&local_30);
  local_48[0] = 2;
  Eigen::Matrix<double,-1,2,1,-1,2>::Matrix<long,long>
            ((Matrix<double,_1,2,1,_1,2> *)&this->m_poles,&stack0xffffffffffffffe0,local_48);
  if ((local_21 & 1) == 0) {
    local_80 = 0;
  }
  else {
    local_80 = IStack_20;
  }
  local_50 = local_80;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_weights,&local_50);
  return;
}

Assistant:

NurbsCurveGeometry(
        const Index degree,
        Index nb_poles,
        bool is_rational)
    : m_degree(degree)
    , m_poles(nb_poles, TDimension)
    , m_weights(is_rational ? nb_poles : 0)
    , m_knots(Nurbs::nb_knots(degree, nb_poles))
    {
        static_assert(TDimension > 0);
    }